

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

void __thiscall GoState<3U,_4U>::dump_board(GoState<3U,_4U> *this,char *file_name)

{
  ostream *poVar1;
  undefined8 in_RSI;
  long in_RDI;
  int j;
  int i;
  ofstream fout;
  uint local_224;
  uint local_220;
  ostream local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,0x10);
  poVar1 = std::operator<<(local_210,"static const int M = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,3);
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"static const int N = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,4);
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"char board[M][N+1] = {");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_220 = 0; local_220 < 3; local_220 = local_220 + 1) {
    std::operator<<(local_210,"\t\"");
    for (local_224 = 0; local_224 < 4; local_224 = local_224 + 1) {
      if (*(char *)(in_RDI + 8 + (long)(int)local_220 * 4 + (long)(int)local_224) == '\0') {
        std::operator<<(local_210,".");
      }
      else {
        std::ostream::operator<<
                  (local_210,
                   (uint)*(byte *)((long)(int)local_224 + 8 + in_RDI + (long)(int)local_220 * 4));
      }
    }
    poVar1 = std::operator<<(local_210,"\",");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_210,"};");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

virtual void dump_board(const char* file_name) const
	{
		std::ofstream fout(file_name);
		fout << "static const int M = " << M << ";" << std::endl;
		fout << "static const int N = " << N << ";" << std::endl;
		fout << "char board[M][N+1] = {" << std::endl;
		for (int i = 0; i < M; ++i) {
			fout << "\t\"";
			for (int j = 0; j < N; ++j) {
				if (board[i][j] == empty) fout << ".";
				else fout << int(board[i][j]);
			}
			fout << "\"," << std::endl;
		}
		fout << "};" << std::endl;
	}